

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O0

void av1_quantize_fp_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan_ptr,
               int16_t *iscan_ptr)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i eob;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  uint16_t uVar10;
  long in_RSI;
  undefined8 uVar11;
  undefined8 uVar15;
  undefined1 auVar12 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  long in_stack_00000008;
  __m256i thr;
  __m256i qp [3];
  int step;
  int log_scale;
  __m256i nz_mask_1;
  __m256i dq_1;
  __m256i q_1;
  __m256i abs_q_1;
  __m256i tmp_rnd_1;
  int nzflag_1;
  __m256i mask_1;
  __m256i abs_coeff_1;
  __m256i coeff_1;
  __m256i nz_mask;
  __m256i dq;
  __m256i q;
  __m256i abs_q;
  __m256i tmp_rnd;
  int nzflag;
  __m256i mask;
  __m256i abs_coeff;
  __m256i coeff;
  __m256i v_nz_iscan;
  __m256i v_iscan_plus1;
  __m256i v_iscan_perm;
  __m256i v_iscan;
  __m256i v_nz_iscan_1;
  __m256i v_iscan_plus1_1;
  __m256i v_iscan_perm_1;
  __m256i v_iscan_1;
  undefined1 local_b00 [16];
  tran_low_t *in_stack_fffffffffffff520;
  __m256i *in_stack_fffffffffffff528;
  __m256i *in_stack_fffffffffffff530;
  undefined4 uStack_ac8;
  int in_stack_fffffffffffff53c;
  int16_t *in_stack_fffffffffffff540;
  int16_t *in_stack_fffffffffffff548;
  tran_low_t *in_stack_fffffffffffff550;
  longlong lVar19;
  longlong lVar20;
  __m256i in_stack_fffffffffffff558;
  longlong lVar21;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  long local_a30;
  ulong uStack_898;
  ulong uStack_718;
  undefined1 auVar18 [32];
  
  lVar19 = in_stack_fffffffffffff558[1];
  lVar20 = in_stack_fffffffffffff558[2];
  lVar21 = in_stack_fffffffffffff558[3];
  uVar11 = 0;
  uVar15 = 0;
  local_b00 = ZEXT816(0);
  auVar18 = ZEXT1632(local_b00);
  uVar16 = 0;
  uVar17 = 0;
  init_qp((int16_t *)in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff540,
          in_stack_fffffffffffff53c,in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  load_coefficients_avx2(in_stack_fffffffffffff520);
  auVar13._8_8_ = uVar15;
  auVar13._0_8_ = uVar11;
  auVar13._16_8_ = uVar16;
  auVar13._24_8_ = uVar17;
  auVar13 = vpabsw_avx2(auVar13);
  auVar1._8_8_ = in_stack_fffffffffffff528;
  auVar1._0_8_ = in_stack_fffffffffffff520;
  auVar1._16_8_ = in_stack_fffffffffffff530;
  auVar1._24_4_ = uStack_ac8;
  auVar1._28_4_ = in_stack_fffffffffffff53c;
  auVar1 = vpcmpgtw_avx2(auVar13,auVar1);
  if ((((((((((((((((((((((((((((((((auVar1 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   && (auVar1 >> 0xf & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                  (auVar1 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                 && (auVar1 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar1 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar1 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar1 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar1 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar1 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar1 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar1 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar1 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar1 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar1 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar1 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar1 >> 0x7f,0) == '\0') &&
                    (auVar1 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar1 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar1 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar1 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar1 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar1 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar1 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar1 >> 0xbf,0) == '\0') &&
            (auVar1 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar1 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar1 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar1 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar1 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (auVar1 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (auVar1 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar1[0x1f]) {
    auVar12 = auVar1._0_16_;
    write_zero((tran_low_t *)0x0);
    write_zero((tran_low_t *)0x0);
  }
  else {
    auVar4._8_8_ = in_stack_fffffffffffff548;
    auVar4._0_8_ = in_stack_fffffffffffff540;
    auVar4._16_8_ = in_stack_fffffffffffff550;
    auVar4._24_8_ = in_stack_fffffffffffff558[0];
    unique0x100024d0 = in_stack_fffffffffffff558[1];
    unique0x100024d8 = in_stack_fffffffffffff558[2];
    unique0x100024e0 = in_stack_fffffffffffff558[3];
    auVar13 = vpaddsw_avx2(auVar13,auVar4);
    auVar6._8_8_ = lVar20;
    auVar6._0_8_ = lVar19;
    auVar6._16_8_ = lVar21;
    auVar6._24_8_ = uStack_a88;
    auVar13 = vpmulhw_avx2(auVar13,auVar6);
    auVar2._8_8_ = uVar15;
    auVar2._0_8_ = uVar11;
    auVar2._16_8_ = uVar16;
    auVar2._24_8_ = uVar17;
    auVar1 = vpsignw_avx2(auVar13,auVar2);
    auVar8._8_8_ = uStack_a78;
    auVar8._0_8_ = local_a80;
    auVar8._16_8_ = uStack_a70;
    auVar8._24_8_ = uStack_a68;
    vpmullw_avx2(auVar1,auVar8);
    uStack_718 = SUB328(ZEXT832(0),4);
    auVar13 = vpcmpgtw_avx2(auVar13,ZEXT832(uStack_718) << 0x40);
    store_coefficients_avx2(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
    store_coefficients_avx2(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
    auVar1 = vpermq_avx2(*(undefined1 (*) [32])scan_ptr,0xd8);
    auVar1 = vpsubw_avx2(auVar1,auVar13);
    auVar13 = vpand_avx2(auVar1,auVar13);
    auVar18 = vpmaxsw_avx2(auVar18,auVar13);
    auVar12 = auVar18._0_16_;
  }
  in_stack_00000008 = in_stack_00000008 + 0x40;
  scan_ptr = scan_ptr + 0x10;
  auVar14 = ZEXT1664(auVar12);
  update_qp((__m256i *)&stack0xfffffffffffff520,(__m256i *)&stack0xfffffffffffff540);
  for (local_a30 = in_RSI + -0x10; auVar13 = auVar14._0_32_, 0 < local_a30;
      local_a30 = local_a30 + -0x10) {
    load_coefficients_avx2(in_stack_fffffffffffff520);
    auVar1 = vpabsw_avx2(auVar13);
    auVar3._8_8_ = in_stack_fffffffffffff528;
    auVar3._0_8_ = in_stack_fffffffffffff520;
    auVar3._16_8_ = in_stack_fffffffffffff530;
    auVar3._24_4_ = uStack_ac8;
    auVar3._28_4_ = in_stack_fffffffffffff53c;
    auVar2 = vpcmpgtw_avx2(auVar1,auVar3);
    if ((((((((((((((((((((((((((((((((auVar2 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                     && (auVar2 >> 0xf & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                    (auVar2 >> 0x17 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar2 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   ) && (auVar2 >> 0x27 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                 (auVar2 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                && (auVar2 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (auVar2 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (auVar2 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar2 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar2 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar2 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar2 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar2 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar2 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar2 >> 0x7f,0) == '\0') &&
                      (auVar2 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar2 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar2 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar2 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar2 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar2 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar2 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar2 >> 0xbf,0) == '\0') &&
              (auVar2 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar2 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar2 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar2 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar2 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar2 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar2 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar2[0x1f]) {
      auVar14 = ZEXT1664(auVar2._0_16_);
      write_zero(auVar18._16_8_);
      write_zero(auVar18._16_8_);
    }
    else {
      auVar5._8_8_ = in_stack_fffffffffffff548;
      auVar5._0_8_ = in_stack_fffffffffffff540;
      auVar5._16_8_ = in_stack_fffffffffffff550;
      auVar5._24_8_ = in_stack_fffffffffffff558[0];
      unique0x10002518 = in_stack_fffffffffffff558[1];
      unique0x10002520 = in_stack_fffffffffffff558[2];
      unique0x10002528 = in_stack_fffffffffffff558[3];
      auVar1 = vpaddsw_avx2(auVar1,auVar5);
      auVar7._8_8_ = lVar20;
      auVar7._0_8_ = lVar19;
      auVar7._16_8_ = lVar21;
      auVar7._24_8_ = uStack_a88;
      auVar1 = vpmulhw_avx2(auVar1,auVar7);
      auVar13 = vpsignw_avx2(auVar1,auVar13);
      auVar9._8_8_ = uStack_a78;
      auVar9._0_8_ = local_a80;
      auVar9._16_8_ = uStack_a70;
      auVar9._24_8_ = uStack_a68;
      vpmullw_avx2(auVar13,auVar9);
      uStack_898 = SUB328(ZEXT832(0),4);
      auVar13 = vpcmpgtw_avx2(auVar1,ZEXT832(uStack_898) << 0x40);
      store_coefficients_avx2(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
      store_coefficients_avx2(in_stack_fffffffffffff558,in_stack_fffffffffffff550);
      auVar1 = vpermq_avx2(*(undefined1 (*) [32])scan_ptr,0xd8);
      auVar1 = vpsubw_avx2(auVar1,auVar13);
      auVar13 = vpand_avx2(auVar1,auVar13);
      auVar18 = vpmaxsw_avx2(auVar18,auVar13);
      auVar14 = ZEXT3264(auVar18);
    }
    in_stack_00000008 = in_stack_00000008 + 0x40;
    scan_ptr = scan_ptr + 0x10;
  }
  eob[1] = (longlong)in_stack_fffffffffffff520;
  eob[0] = auVar18._24_8_;
  eob[2] = (longlong)in_stack_fffffffffffff528;
  eob[3] = (longlong)in_stack_fffffffffffff530;
  uVar10 = quant_gather_eob(eob);
  *dequant_ptr = uVar10;
  return;
}

Assistant:

void av1_quantize_fp_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                          const int16_t *zbin_ptr, const int16_t *round_ptr,
                          const int16_t *quant_ptr,
                          const int16_t *quant_shift_ptr,
                          tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                          const int16_t *dequant_ptr, uint16_t *eob_ptr,
                          const int16_t *scan_ptr, const int16_t *iscan_ptr) {
  (void)scan_ptr;
  (void)zbin_ptr;
  (void)quant_shift_ptr;

  const int log_scale = 0;
  const int step = 16;
  __m256i qp[3], thr;
  __m256i eob = _mm256_setzero_si256();

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, &thr, qp);

  quantize_fp_16(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr, &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan_ptr += step;
  n_coeffs -= step;

  update_qp(&thr, qp);

  while (n_coeffs > 0) {
    quantize_fp_16(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                   &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan_ptr += step;
    n_coeffs -= step;
  }
  *eob_ptr = quant_gather_eob(eob);
}